

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall
Highs::getCols(Highs *this,HighsInt from_col,HighsInt to_col,HighsInt *num_col,double *costs,
              double *lower,double *upper,HighsInt *num_nz,HighsInt *start,HighsInt *index,
              double *value)

{
  HighsInt HVar1;
  HighsStatus HVar2;
  HighsIndexCollection index_collection;
  
  if (to_col < from_col) {
    *num_col = 0;
    *num_nz = 0;
    HVar2 = kOk;
  }
  else {
    index_collection.dimension_ = -1;
    index_collection.is_interval_ = false;
    index_collection.from_ = -1;
    index_collection.to_ = -2;
    index_collection.is_set_ = false;
    index_collection.set_num_entries_ = -1;
    index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish._1_7_ = 0;
    index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    index_collection._41_8_ = 0;
    HVar1 = create(&index_collection,from_col,to_col,(this->model_).lp_.num_col_);
    if (HVar1 == 0) {
      HVar2 = kOk;
      getColsInterface(this,&index_collection,num_col,costs,lower,upper,num_nz,start,index,value);
    }
    else {
      highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                   "Interval [%d, %d] supplied to Highs::getCols is out of range [0, %d)\n",
                   (ulong)(uint)from_col,(ulong)(uint)to_col,
                   (ulong)(uint)(this->model_).lp_.num_col_);
      HVar2 = kError;
    }
    HighsIndexCollection::~HighsIndexCollection(&index_collection);
  }
  return HVar2;
}

Assistant:

HighsStatus Highs::getCols(const HighsInt from_col, const HighsInt to_col,
                           HighsInt& num_col, double* costs, double* lower,
                           double* upper, HighsInt& num_nz, HighsInt* start,
                           HighsInt* index, double* value) const {
  if (from_col > to_col) {
    // Empty interval
    num_col = 0;
    num_nz = 0;
    return HighsStatus::kOk;
  }
  HighsIndexCollection index_collection;
  const HighsInt create_error =
      create(index_collection, from_col, to_col, model_.lp_.num_col_);
  if (create_error) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Interval [%d, %d] supplied to Highs::getCols is out of range "
                 "[0, %d)\n",
                 int(from_col), int(to_col), int(model_.lp_.num_col_));
    return HighsStatus::kError;
  }
  getColsInterface(index_collection, num_col, costs, lower, upper, num_nz,
                   start, index, value);
  return HighsStatus::kOk;
}